

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  ostream *poVar2;
  Real RVar3;
  char cVar4;
  int iVar5;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_250;
  cpp_dec_float<50U,_int,_void> local_218;
  cpp_dec_float<50U,_int,_void> local_1e0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," --- verifying computed solution",0x20);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_68,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e0,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_218,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_250,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_288,0,(type *)0x0);
  getBoundViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1e0,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_68);
  getRowViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_218,
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_68);
  getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_250,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68);
  getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_288,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_68);
  RVar3 = Tolerances::floatingPointFeastol
                    ((this->_solver).
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if ((NAN(RVar3)) || (local_1e0.fpclass == cpp_dec_float_NaN)) {
LAB_0034d47b:
    RVar3 = Tolerances::floatingPointFeastol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!NAN(RVar3)) && (local_218.fpclass != cpp_dec_float_NaN)) {
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems._24_5_ = 0;
      local_1a8.data._M_elems[7]._1_3_ = 0;
      local_1a8.data._M_elems._32_5_ = 0;
      local_1a8._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar3);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_218,&local_1a8);
      if (-1 < iVar5) goto LAB_0034d597;
    }
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!NAN(RVar3)) && (local_250.fpclass != cpp_dec_float_NaN)) {
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems._24_5_ = 0;
      local_1a8.data._M_elems[7]._1_3_ = 0;
      local_1a8.data._M_elems._32_5_ = 0;
      local_1a8._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar3);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_250,&local_1a8);
      if (-1 < iVar5) goto LAB_0034d597;
    }
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (NAN(RVar3)) {
      return;
    }
    if (local_288.fpclass == cpp_dec_float_NaN) {
      return;
    }
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar3);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_288,&local_1a8);
    if (iVar5 < 0) {
      return;
    }
  }
  else {
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar3);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_1e0,&local_1a8);
    if (iVar5 < 0) goto LAB_0034d47b;
  }
LAB_0034d597:
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_0034d7eb;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[5],"bound violation: ",0x11);
    local_a8.m_backend.data._M_elems[0] = local_1e0.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_1e0.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_1e0.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_1e0.data._M_elems[3];
    local_a8.m_backend.data._M_elems[4] = local_1e0.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_1e0.data._M_elems[5];
    local_a8.m_backend.data._M_elems[6] = local_1e0.data._M_elems[6];
    local_a8.m_backend.data._M_elems[7] = local_1e0.data._M_elems[7];
    local_a8.m_backend.data._M_elems[8] = local_1e0.data._M_elems[8];
    local_a8.m_backend.data._M_elems[9] = local_1e0.data._M_elems[9];
    local_a8.m_backend.exp = local_1e0.exp;
    local_a8.m_backend.neg = local_1e0.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", row violation: ",0x11);
    local_e8.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = local_218.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = local_218.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
    local_e8.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
    local_e8.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
    local_e8.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
    local_e8.m_backend.data._M_elems[8] = local_218.data._M_elems[8];
    local_e8.m_backend.data._M_elems[9] = local_218.data._M_elems[9];
    local_e8.m_backend.exp = local_218.exp;
    local_e8.m_backend.neg = local_218.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", dual violation: ",0x12);
    local_128.m_backend.data._M_elems[0] = local_250.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_250.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_250.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_250.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_250.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_250.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_250.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_250.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = local_250.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_250.data._M_elems[9];
    local_128.m_backend.exp = local_250.exp;
    local_128.m_backend.neg = local_250.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_128);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", redcost violation: ",0x15);
    local_168.m_backend.data._M_elems[0] = local_288.data._M_elems[0];
    local_168.m_backend.data._M_elems[1] = local_288.data._M_elems[1];
    local_168.m_backend.data._M_elems[2] = local_288.data._M_elems[2];
    local_168.m_backend.data._M_elems[3] = local_288.data._M_elems[3];
    local_168.m_backend.data._M_elems[4] = local_288.data._M_elems[4];
    local_168.m_backend.data._M_elems[5] = local_288.data._M_elems[5];
    local_168.m_backend.data._M_elems[6] = local_288.data._M_elems[6];
    local_168.m_backend.data._M_elems[7] = local_288.data._M_elems[7];
    local_168.m_backend.data._M_elems[8] = local_288.data._M_elems[8];
    local_168.m_backend.data._M_elems[9] = local_288.data._M_elems[9];
    local_168.m_backend.exp = local_288.exp;
    local_168.m_backend.neg = local_288.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_168);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  (this->spxout).m_verbosity = INFO1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->spxout).m_streams[3],
             " --- detected violations in original problem space -- solve again without presolving/scaling"
             ,0x5c);
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  cVar4 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  (this->spxout).m_verbosity = VVar1;
LAB_0034d7eb:
  if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}